

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_program_ast(FILE *out,Program *program)

{
  Queue_Node *local_28;
  Queue_Node *it;
  size_t i;
  Program *program_local;
  FILE *out_local;
  
  for (local_28 = program->translation_units->first; local_28 != (Queue_Node *)0x0;
      local_28 = local_28->prev) {
    fprintf((FILE *)out,"TRANSLATION_UNIT {\n");
    print_ast(out,(AST *)local_28->data);
    fprintf((FILE *)out,"\n} TRANSLATION_UNIT_END\n");
  }
  return;
}

Assistant:

void print_program_ast(FILE *out,struct Program *program)
{
	size_t i;
	struct Queue_Node *it;
	for(it=program->translation_units->first;it!=NULL;it=it->prev)
	{
		fprintf(out,"TRANSLATION_UNIT {\n");
		print_ast(out,(struct AST*)it->data);
		fprintf(out,"\n} TRANSLATION_UNIT_END\n");
	}
}